

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RS232Port.h
# Opt level: O0

int ReadRS232Port(RS232PORT *pRS232Port,uint8 *readbuf,int readbuflen,int *pReadBytes)

{
  ssize_t sVar1;
  int *pReadBytes_local;
  int readbuflen_local;
  uint8 *readbuf_local;
  RS232PORT *pRS232Port_local;
  
  if (pRS232Port->DevType == 0) {
    pRS232Port_local._4_4_ = ReadComputerRS232Port(pRS232Port->hDev,readbuf,readbuflen,pReadBytes);
  }
  else if (pRS232Port->DevType - 1U < 4) {
    sVar1 = recv(pRS232Port->s,readbuf,(long)readbuflen,0);
    *pReadBytes = (int)sVar1;
    if (*pReadBytes < 0) {
      pRS232Port_local._4_4_ = 1;
    }
    else if (*pReadBytes == 0) {
      pRS232Port_local._4_4_ = 2;
    }
    else {
      pRS232Port_local._4_4_ = 0;
    }
  }
  else {
    pRS232Port_local._4_4_ = 1;
  }
  return pRS232Port_local._4_4_;
}

Assistant:

inline int ReadRS232Port(RS232PORT* pRS232Port, uint8* readbuf, int readbuflen, int* pReadBytes)
{
	switch (pRS232Port->DevType)
	{
	case TCP_CLIENT_TYPE_RS232PORT:
	case TCP_SERVER_TYPE_RS232PORT:
	case UDP_CLIENT_TYPE_RS232PORT:
	case UDP_SERVER_TYPE_RS232PORT:
		{
#ifdef _DEBUG_MESSAGES_RS232PORT
			int i = 0;
#endif // _DEBUG_MESSAGES_RS232PORT

			*pReadBytes = recv(pRS232Port->s, (char*)readbuf, readbuflen, 0);
			if (*pReadBytes >= 0)
			{
				if (*pReadBytes == 0)
				{
					PRINT_DEBUG_WARNING_RS232PORT(("ReadRS232Port warning (%s) : %s"
						"(pRS232Port=%#x, readbuf=%#x, readbuflen=%d)\n", 
						strtime_m(), 
						szOSUtilsErrMsgs[EXIT_TIMEOUT], 
						pRS232Port, readbuf, readbuflen));
					return EXIT_TIMEOUT;
				}
				else
				{
#ifdef _DEBUG_MESSAGES_RS232PORT
					for (i = 0; i < *pReadBytes; i++)
					{
						PRINT_DEBUG_MESSAGE_RS232PORT(("%.2x ", (int)readbuf[i]));
					}
					PRINT_DEBUG_MESSAGE_RS232PORT(("\n"));
#endif // _DEBUG_MESSAGES
					PRINT_DEBUG_MESSAGE_RS232PORT(("Bytes read : %d\n", *pReadBytes));
				}
			}
			else
			{
				PRINT_DEBUG_ERROR_RS232PORT(("ReadRS232Port error (%s) : %s"
					"(pRS232Port=%#x, readbuf=%#x, readbuflen=%d)\n", 
					strtime_m(), 
					WSAGetLastErrorMsg(), 
					pRS232Port, readbuf, readbuflen));
				return EXIT_FAILURE;
			}

			return EXIT_SUCCESS;
		}
	case LOCAL_TYPE_RS232PORT:
		return ReadComputerRS232Port(pRS232Port->hDev, readbuf, (int)readbuflen, pReadBytes);
	default:
		PRINT_DEBUG_ERROR_RS232PORT(("ReadRS232Port error (%s) : %s"
			"(pRS232Port=%#x, readbuf=%#x, readbuflen=%d)\n", 
			strtime_m(), 
			"Invalid device type. ", 
			pRS232Port, readbuf, readbuflen));
		return EXIT_FAILURE;
	}
}